

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

MeanVarianceNormalizeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_mvn(NeuralNetworkLayer *this)

{
  bool bVar1;
  MeanVarianceNormalizeLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_mvn(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_mvn(this);
    this_00 = (MeanVarianceNormalizeLayerParams *)operator_new(0x20);
    MeanVarianceNormalizeLayerParams::MeanVarianceNormalizeLayerParams(this_00);
    (this->layer_).mvn_ = this_00;
  }
  return (MeanVarianceNormalizeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MeanVarianceNormalizeLayerParams* NeuralNetworkLayer::mutable_mvn() {
  if (!has_mvn()) {
    clear_layer();
    set_has_mvn();
    layer_.mvn_ = new ::CoreML::Specification::MeanVarianceNormalizeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.mvn)
  return layer_.mvn_;
}